

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O2

void cuddPrintNode(DdNode *f,FILE *fp)

{
  uint *puVar1;
  
  puVar1 = (uint *)((ulong)f & 0xfffffffffffffffe);
  fprintf((FILE *)fp,"       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",puVar1,
          (ulong)*puVar1,(ulong)puVar1[1],*(undefined8 *)(puVar1 + 4),*(undefined8 *)(puVar1 + 6));
  return;
}

Assistant:

void
cuddPrintNode(
  DdNode * f,
  FILE *fp)
{
    f = Cudd_Regular(f);
#if SIZEOF_VOID_P == 8
    (void) fprintf(fp,"       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",(ptruint)f,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#else
    (void) fprintf(fp,"       node 0x%x, id = %hu, ref = %hu, then = 0x%x, else = 0x%x\n",(ptruint)f,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#endif

}